

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::InternalSerializeWithCachedSizesToArray
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *this,bool deterministic,uint8 *output)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  uint8 *puVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])();
  *output = '\n';
  puVar3 = io::CodedOutputStream::WriteStringWithSizeToArray
                     ((string *)CONCAT44(extraout_var,iVar1),output + 1);
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar1);
  *puVar3 = '\x12';
  pbVar7 = puVar3 + 1;
  uVar5 = (**(code **)(*plVar4 + 0x78))(plVar4);
  if ((uint)uVar5 < 0x80) {
    uVar5 = uVar5 & 0xffffffff;
  }
  else {
    uVar6 = uVar5 & 0xffffffff;
    do {
      uVar2 = (uint)uVar5;
      *pbVar7 = (byte)uVar5 | 0x80;
      uVar5 = uVar6 >> 7;
      pbVar7 = pbVar7 + 1;
      uVar6 = uVar5;
    } while (0x3fff < uVar2);
  }
  *pbVar7 = (byte)uVar5;
  puVar3 = (uint8 *)(**(code **)(*plVar4 + 0x80))(plVar4,deterministic,pbVar7 + 1);
  return puVar3;
}

Assistant:

::google::protobuf::uint8* InternalSerializeWithCachedSizesToArray(bool deterministic,
                                                   ::google::protobuf::uint8* output) const {
    output = KeyTypeHandler::InternalWriteToArray(kKeyFieldNumber, key(),
                                                  deterministic, output);
    output = ValueTypeHandler::InternalWriteToArray(kValueFieldNumber, value(),
                                                    deterministic, output);
    return output;
  }